

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

ssize_t __thiscall asl::Socket_::read(Socket_ *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  ulong unaff_R13;
  void *__buf_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  uVar4 = 0;
  uVar5 = (ulong)__buf & 0xffffffff;
  while( true ) {
    uVar2 = ::read(*(int *)&(this->super_SmartObject_).field_0xc,__buf_00,(long)(int)uVar5);
    iVar3 = 1;
    uVar1 = (uint)uVar2;
    if (this->_blocking == true) {
      if ((int)uVar1 < 1) {
        this->_error = 5;
        iVar3 = 2;
      }
      else {
        __buf_00 = (void *)((long)__buf_00 + (ulong)(uVar1 & 0x7fffffff));
        uVar4 = uVar4 + uVar1;
        uVar5 = (ulong)((int)uVar5 - uVar1);
        iVar3 = 0;
      }
    }
    else {
      unaff_R13 = uVar2 & 0xffffffff;
    }
    if (iVar3 != 0) break;
    if ((int)__buf <= (int)uVar4) {
LAB_0011db39:
      return (ulong)uVar4;
    }
  }
  if (iVar3 != 2) {
    uVar4 = (uint)unaff_R13;
  }
  goto LAB_0011db39;
}

Assistant:

int Socket_::read(void* data, int size)
{
		int s = 0, size0 = size;
		do
		{
#ifdef _WIN32
		int n = recv(_handle, (char*)data, size, 0);
#else
		int n = ::read(_handle, (char*)data, size);
#endif
		if (!_blocking)
			return n;
			if (n <= 0)
			{
			_error = SOCKET_BAD_RECV;
			break;
		}
		data = (char*)data + n;
		s += n;
		size -= n;
		} while (s < size0);
	return s;
	}